

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O3

int ssl_check_server_ecdh_params(mbedtls_ssl_context *ssl)

{
  int iVar1;
  int iVar2;
  mbedtls_ecp_curve_info *pmVar3;
  
  pmVar3 = mbedtls_ecp_curve_info_from_grp_id((ssl->handshake->ecdh_ctx).grp.id);
  if (pmVar3 == (mbedtls_ecp_curve_info *)0x0) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x6db,"should never happen");
    iVar2 = -0x6c00;
  }
  else {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x6df,"ECDH curve: %s",pmVar3->name);
    iVar1 = mbedtls_ssl_check_curve(ssl,(ssl->handshake->ecdh_ctx).grp.id);
    iVar2 = -1;
    if (iVar1 == 0) {
      mbedtls_debug_print_ecp
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x6e9,"ECDH: Qp",&(ssl->handshake->ecdh_ctx).Qp);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int ssl_check_server_ecdh_params( const mbedtls_ssl_context *ssl )
{
    const mbedtls_ecp_curve_info *curve_info;

    curve_info = mbedtls_ecp_curve_info_from_grp_id( ssl->handshake->ecdh_ctx.grp.id );
    if( curve_info == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "ECDH curve: %s", curve_info->name ) );

#if defined(MBEDTLS_ECP_C)
    if( mbedtls_ssl_check_curve( ssl, ssl->handshake->ecdh_ctx.grp.id ) != 0 )
#else
    if( ssl->handshake->ecdh_ctx.grp.nbits < 163 ||
        ssl->handshake->ecdh_ctx.grp.nbits > 521 )
#endif
        return( -1 );

    MBEDTLS_SSL_DEBUG_ECP( 3, "ECDH: Qp", &ssl->handshake->ecdh_ctx.Qp );

    return( 0 );
}